

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_region.cpp
# Opt level: O0

void __thiscall Region_GrowByMinimumSize_Test::TestBody(Region_GrowByMinimumSize_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer *this_01;
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  element_type *peVar6;
  char *in_R9;
  string local_2a0;
  AssertHelper local_280;
  Message local_278;
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__1;
  Message local_250;
  uint64_t local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_6;
  Message local_228;
  uint64_t local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_5;
  Message local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_4;
  element_type *local_1d8;
  void *actual;
  uint8_t *expected;
  element_type *region1;
  AssertHelper local_1a0;
  Message local_198;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_;
  Message local_170;
  uint64_t local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  Message local_148;
  uint64_t local_140;
  uint local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  Message local_118;
  undefined1 local_110 [16];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  element_type *region0;
  AssertHelper local_e0;
  Message local_d8;
  size_type local_d0;
  uint local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  result;
  undefined1 local_80 [8];
  mem_based_factory factory;
  undefined1 local_48 [8];
  shared_ptr<pstore::file::in_memory> file;
  shared_ptr<unsigned_char> sp;
  size_t file_size;
  size_t small_region_size;
  size_t big_region_size;
  Region_GrowByMinimumSize_Test *this_local;
  
  small_region_size = 0x40;
  file_size = 0x10;
  sp.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x50;
  this_00 = &file.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  big_region_size = (size_t)this;
  anon_unknown.dwarf_1ca3d2::Region::make_array((Region *)this_00,(size_t)this);
  std::
  make_shared<pstore::file::in_memory,std::shared_ptr<unsigned_char>&,unsigned_long_const&,unsigned_long_const&>
            ((shared_ptr<unsigned_char> *)local_48,(unsigned_long *)this_00,
             (unsigned_long *)
             &sp.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this_01 = &result.
             super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::shared_ptr<pstore::file::in_memory>::shared_ptr
            ((shared_ptr<pstore::file::in_memory> *)this_01,
             (shared_ptr<pstore::file::in_memory> *)local_48);
  pstore::region::mem_based_factory::mem_based_factory
            ((mem_based_factory *)local_80,(shared_ptr<pstore::file::in_memory> *)this_01,0x40,0x10)
  ;
  std::shared_ptr<pstore::file::in_memory>::~shared_ptr
            ((shared_ptr<pstore::file::in_memory> *)
             &result.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pstore::region::mem_based_factory::init
            ((mem_based_factory *)&stack0xffffffffffffff58,(EVP_PKEY_CTX *)local_80);
  pstore::gsl::
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  ::not_null((not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
              *)&gtest_ar.message_,
             (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              *)&stack0xffffffffffffff58);
  pstore::region::mem_based_factory::add
            ((mem_based_factory *)local_80,
             (not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
              )gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,0x40,0x50);
  local_c4 = 2;
  local_d0 = std::
             vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ::size((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                     *)&stack0xffffffffffffff58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_c0,"2U","result.size ()",&local_c4,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pMVar2 = testing::Message::operator<<
                       (&local_d8,
                        (char (*) [52])"The region factory did not return exactly 2 regions");
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
               ,0xd4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  if (bVar1) {
    p_Var4 = (__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                ::at((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                      *)&stack0xffffffffffffff58,0);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::
           __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(p_Var4);
    pstore::memory_mapper_base::data((memory_mapper_base *)local_110);
    testing::internal::EqHelper::
    Compare<std::shared_ptr<unsigned_char>,_std::shared_ptr<const_void>,_nullptr>
              ((EqHelper *)local_100,"sp","region0.data ()",
               (shared_ptr<unsigned_char> *)
               &file.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(shared_ptr<const_void> *)local_110);
    std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)local_110);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0xd8,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    local_134 = 0;
    local_140 = pstore::memory_mapper_base::offset
                          ((memory_mapper_base *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_130,"0U","region0.offset ()",&local_134,&local_140);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0xd9,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_148);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    local_168 = pstore::memory_mapper_base::size
                          ((memory_mapper_base *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_160,"big_region_size","region0.size ()",&small_region_size,
               &local_168);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
    if (!bVar1) {
      testing::Message::Message(&local_170);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0xda,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
    local_189 = pstore::memory_mapper_base::is_writable
                          ((memory_mapper_base *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_188,&local_189,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_198);
      pMVar2 = testing::Message::operator<<
                         (&local_198,(char (*) [42])"The 1st region is expected to be writable");
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&region1,(internal *)local_188,
                 (AssertionResult *)"region0.is_writable ()","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0xdb,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1a0,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      std::__cxx11::string::~string((string *)&region1);
      testing::Message::~Message(&local_198);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    p_Var4 = (__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                ::at((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                      *)&stack0xffffffffffffff58,1);
    expected = (uint8_t *)
               std::
               __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(p_Var4);
    peVar5 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)
                        &file.
                         super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    actual = peVar5 + 0x40;
    pstore::memory_mapper_base::data((memory_mapper_base *)&gtest_ar_4.message_);
    peVar6 = std::__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_4.message_
                       );
    std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)&gtest_ar_4.message_);
    local_1d8 = peVar6;
    testing::internal::EqHelper::Compare<const_unsigned_char_*,_const_void_*,_nullptr>
              ((EqHelper *)local_1f8,"expected","actual",(uchar **)&actual,&local_1d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
    if (!bVar1) {
      testing::Message::Message(&local_200);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0xe2,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_200);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_200);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
    local_220 = pstore::memory_mapper_base::offset((memory_mapper_base *)expected);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_218,"big_region_size","region1.offset ()",&small_region_size,
               &local_220);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
    if (!bVar1) {
      testing::Message::Message(&local_228);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0xe3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_228);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_228);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
    local_248 = pstore::memory_mapper_base::size((memory_mapper_base *)expected);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_240,"small_region_size","region1.size ()",&file_size,&local_248);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0xe4,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_250);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    local_269 = pstore::memory_mapper_base::is_writable((memory_mapper_base *)expected);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_268,&local_269,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      pMVar2 = testing::Message::operator<<
                         (&local_278,(char (*) [42])"The 2nd region is expected to be writable");
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2a0,(internal *)local_268,(AssertionResult *)"region1.is_writable ()",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_280,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0xe5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_280,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      testing::Message::~Message(&local_278);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  }
  std::
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  ::~vector((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             *)&stack0xffffffffffffff58);
  pstore::region::mem_based_factory::~mem_based_factory((mem_based_factory *)local_80);
  std::shared_ptr<pstore::file::in_memory>::~shared_ptr
            ((shared_ptr<pstore::file::in_memory> *)local_48);
  std::shared_ptr<unsigned_char>::~shared_ptr
            ((shared_ptr<unsigned_char> *)
             &file.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST_F (Region, GrowByMinimumSize) {
    constexpr std::size_t big_region_size = 64;
    constexpr std::size_t small_region_size = 16;
    constexpr std::size_t file_size = big_region_size + small_region_size;

    // Make a file which contains big-region bytes.
    auto sp = this->make_array (file_size);
    auto file = std::make_shared<pstore::file::in_memory> (sp, file_size, big_region_size);

    pstore::region::mem_based_factory factory (file, big_region_size, small_region_size);
    auto result = factory.init ();
    factory.add (&result, big_region_size, big_region_size + small_region_size);

    ASSERT_EQ (2U, result.size ()) << "The region factory did not return exactly 2 regions";
    {
        auto const & region0 = *(result.at (0));

        EXPECT_EQ (sp, region0.data ());
        EXPECT_EQ (0U, region0.offset ());
        EXPECT_EQ (big_region_size, region0.size ());
        EXPECT_TRUE (region0.is_writable ()) << "The 1st region is expected to be writable";
    }
    {
        auto const & region1 = *(result.at (1));
        std::uint8_t const * expected = sp.get () + big_region_size;
        void const * actual = region1.data ().get ();

        EXPECT_EQ (expected, actual);
        EXPECT_EQ (big_region_size, region1.offset ());
        EXPECT_EQ (small_region_size, region1.size ());
        EXPECT_TRUE (region1.is_writable ()) << "The 2nd region is expected to be writable";
    }
}